

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

void anon_unknown.dwarf_1ece32d::muladd3(limb_t *c0,limb_t *c1,limb_t *c2,limb_t *a,limb_t *b)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong *in_RCX;
  long *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong *in_R8;
  long in_FS_OFFSET;
  limb_t tl;
  limb_t th;
  double_limb_t t;
  undefined8 local_48;
  undefined8 local_40;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *in_RCX;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *in_R8;
  local_40 = SUB168(auVar3 * auVar4,8);
  local_48 = SUB168(auVar3 * auVar4,0);
  *in_RDI = *in_RDI + local_48;
  uVar1 = local_40 + (ulong)(*in_RDI < local_48);
  *in_RSI = *in_RSI + uVar1;
  *in_RDX = *in_RDX + (ulong)(*in_RSI < uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void muladd3(limb_t& c0, limb_t& c1, limb_t& c2, const limb_t& a, const limb_t& b)
{
    double_limb_t t = (double_limb_t)a * b;
    limb_t th = t >> LIMB_SIZE;
    limb_t tl = t;

    c0 += tl;
    th += (c0 < tl) ? 1 : 0;
    c1 += th;
    c2 += (c1 < th) ? 1 : 0;
}